

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

_Bool arm_cpu_exec_interrupt_aarch64(CPUState *cs,int interrupt_request)

{
  CPUARMState_conflict *env;
  ulong uVar1;
  CPUClass *pCVar2;
  void *pvVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  byte bVar6;
  int32_t iVar7;
  char cVar8;
  uint uVar9;
  _Bool secure;
  bool bVar10;
  
  env = (CPUARMState_conflict *)cs->env_ptr;
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar9 = env->uncached_cpsr & 0x1f;
      if (uVar9 == 0x10) {
        uVar9 = 0;
      }
      else if (uVar9 == 0x16) {
        uVar9 = 3;
      }
      else if (uVar9 == 0x1a) {
        uVar9 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          bVar10 = uVar9 == 0x16;
          if (!bVar10) {
            bVar10 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar9 = 3, bVar10)) goto LAB_0060eba7;
        }
        uVar9 = 1;
      }
    }
    else {
      uVar9 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar9 = 1;
    if ((env->v7m).exception == 0) {
      uVar9 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0060eba7:
  if ((uVar1 & 0x200000000) == 0) {
    secure = false;
  }
  else {
    if (env->aarch64 == 0) {
      secure = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      secure = (~env->pstate & 0xc) == 0;
    }
    if (!secure) {
      secure = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  pCVar2 = cs->cc;
  uVar5 = arm_hcr_el2_eff_aarch64(env);
  if (((interrupt_request & 0x10U) != 0) &&
     (uVar4 = arm_phys_excp_target_el_aarch64(cs,6,uVar9,secure), uVar9 <= uVar4)) {
    pvVar3 = cs->env_ptr;
    bVar10 = (*(ulong *)((long)pvVar3 + 0x230) & 0x40) == 0;
    if (uVar4 == 1 || uVar4 <= uVar9) goto LAB_0060ecf6;
    if ((*(byte *)((long)pvVar3 + 0x3033) & 0x10) == 0) {
      if ((*(ulong *)((long)pvVar3 + 0x3c0) & 4) == 0) {
        if ((uVar5 & 8) != 0) {
LAB_0060ece8:
          bVar6 = secure ^ 1;
          goto LAB_0060ecf4;
        }
      }
      else if (((uVar5 & 8) == 0 & (byte)(((uint)*(ulong *)((long)pvVar3 + 0x3c0) & 0x10) >> 4)) ==
               0) goto LAB_0060ece8;
    }
    else {
      bVar6 = secure ^ 1U | uVar4 == 3;
LAB_0060ecf4:
      bVar10 = (bool)(bVar6 | (*(ulong *)((long)pvVar3 + 0x230) & 0x40) == 0);
    }
LAB_0060ecf6:
    if (bVar10 != false) {
      iVar7 = 6;
      goto LAB_0060edf6;
    }
  }
  if (((interrupt_request & 2U) != 0) &&
     (uVar4 = arm_phys_excp_target_el_aarch64(cs,5,uVar9,secure), uVar9 <= uVar4)) {
    cVar8 = (char)*(undefined8 *)((long)cs->env_ptr + 0x230);
    bVar10 = -1 < cVar8;
    if (uVar4 != 1 && uVar9 < uVar4) {
      if ((*(byte *)((long)cs->env_ptr + 0x3033) & 0x10) == 0) {
        if ((uVar5 & 0x10) == 0) goto LAB_0060ed7c;
        bVar6 = secure ^ 1;
      }
      else {
        bVar6 = secure ^ 1U | uVar4 == 3;
      }
      bVar10 = (bool)(bVar6 | -1 < cVar8);
    }
LAB_0060ed7c:
    if (bVar10 != false) {
      iVar7 = 5;
      goto LAB_0060edf6;
    }
  }
  if (((((interrupt_request & 0x40U) == 0) || (1 < uVar9)) ||
      (((uint)uVar5 & 0x8000010) != 0x10 || secure != false)) ||
     ((*(byte *)((long)cs->env_ptr + 0x230) & 0x80) != 0)) {
    if (((((uint)interrupt_request >> 9 & 1) == 0) || (1 < uVar9)) ||
       ((secure != false || ((uint)uVar5 & 0x8000008) != 8 ||
        ((*(byte *)((long)cs->env_ptr + 0x230) & 0x40) != 0)))) {
      return false;
    }
    iVar7 = 0xf;
  }
  else {
    iVar7 = 0xe;
  }
  uVar4 = 1;
LAB_0060edf6:
  cs->exception_index = iVar7;
  (env->exception).target_el = uVar4;
  (*pCVar2->do_interrupt)((CPUState_conflict *)cs);
  return true;
}

Assistant:

bool arm_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    CPUClass *cc = CPU_GET_CLASS(cs);
    CPUARMState *env = cs->env_ptr;
    uint32_t cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr_el2 = arm_hcr_el2_eff(env);
    uint32_t target_el;
    uint32_t excp_idx;

    /* The prioritization of interrupts is IMPLEMENTATION DEFINED. */

    if (interrupt_request & CPU_INTERRUPT_FIQ) {
        excp_idx = EXCP_FIQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        excp_idx = EXCP_IRQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VIRQ) {
        excp_idx = EXCP_VIRQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VFIQ) {
        excp_idx = EXCP_VFIQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    return false;

 found:
    cs->exception_index = excp_idx;
    env->exception.target_el = target_el;
    cc->do_interrupt(cs);
    return true;
}